

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_adds_unsubscribe_and_refresh_control_Test
::
SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_adds_unsubscribe_and_refresh_control_Test
          (SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_adds_unsubscribe_and_refresh_control_Test
           *this)

{
  SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_adds_unsubscribe_and_refresh_control_Test
  *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &
       PTR__SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_adds_unsubscribe_and_refresh_control_Test_003db340
  ;
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_RFQ_toggle_only_adds_unsubscribe_and_refresh_control)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    subject_register.NextSubscriptionSync();

    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    EXPECT_EQ(ControlOperationEnum::TOGGLE, subject_register.NextSubscriptionSync()->GetControls().begin()->second);
}